

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void verify_stale_block_reuse_test(void)

{
  fdb_status fVar1;
  void *__s;
  char *pcVar2;
  FILE *pFVar3;
  uint uVar4;
  int iVar5;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  uint64_t local_1a8;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *lazy;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0x14;
  fVar1 = fdb_open(&dbfile,"./staleblktest1",&fconfig);
  pFVar3 = _stderr;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
    pFVar3 = _stderr;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      __s = operator_new__(0x2800);
      memset(__s,0,0x2800);
      uVar4 = 0xfffffffe;
      do {
        uVar4 = uVar4 + 2;
        if (2999 < uVar4) {
          fVar1 = fdb_get_file_info(dbfile,&file_info);
          pFVar3 = _stderr;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            pcVar2 = fdb_error_msg(fVar1);
            uVar4 = 0x4d;
            goto LAB_00103d0b;
          }
          local_1a8 = file_info.file_size;
          fVar1 = fdb_kvs_open(dbfile,&lazy,"lazy",&kvs_config);
          pFVar3 = _stderr;
          if (fVar1 == FDB_RESULT_SUCCESS) {
            iVar5 = 0x3e9;
            goto LAB_00103d95;
          }
          pcVar2 = fdb_error_msg(fVar1);
          uVar4 = 0x52;
          goto LAB_00103d0b;
        }
        fVar1 = fdb_set_kv(db,"key",4,__s,0x2800);
        pFVar3 = _stderr;
      } while (fVar1 == FDB_RESULT_SUCCESS);
      pcVar2 = fdb_error_msg(fVar1);
      uVar4 = 0x43;
LAB_00103d0b:
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,uVar4);
      verify_stale_block_reuse_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,uVar4,"void verify_stale_block_reuse_test()");
    }
    pcVar2 = fdb_error_msg(fVar1);
    uVar4 = 0x3b;
  }
  else {
    pcVar2 = fdb_error_msg(fVar1);
    uVar4 = 0x39;
  }
LAB_00104077:
  fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,(ulong)uVar4);
  pcVar2 = "false";
  goto LAB_00103f1c;
  while( true ) {
    fVar1 = fdb_set_kv(db,"key",4,__s,10);
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      uVar4 = 0x58;
      goto LAB_00103eed;
    }
    fVar1 = fdb_commit(dbfile,'\x01');
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) break;
LAB_00103d95:
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      fVar1 = fdb_get_file_info(dbfile,&file_info);
      pFVar3 = _stderr;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar2 = fdb_error_msg(fVar1);
        uVar4 = 0x5e;
        goto LAB_00103d0b;
      }
      if ((((double)CONCAT44(0x45300000,(int)(local_1a8 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_1a8) - 4503599627370496.0)) * 1.3 <=
          ((double)CONCAT44(0x45300000,(int)(file_info.file_size >> 0x20)) - 1.9342813113834067e+25)
          + ((double)CONCAT44(0x43300000,(int)file_info.file_size) - 4503599627370496.0)) {
        uVar4 = 0x61;
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x61);
        pcVar2 = "double(fileSize2) < double(fileSize1) * 1.3";
        goto LAB_00103f1c;
      }
      operator_delete__(__s);
      fVar1 = fdb_close(dbfile);
      pFVar3 = _stderr;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fVar1 = fdb_shutdown();
        pFVar3 = _stderr;
        if (fVar1 == FDB_RESULT_SUCCESS) {
          pcVar2 = "%s PASSED\n";
          if (verify_stale_block_reuse_test()::__test_pass != '\0') {
            pcVar2 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar2,"basic stale block reuse test");
          return;
        }
        pcVar2 = fdb_error_msg(fVar1);
        uVar4 = 0x68;
      }
      else {
        pcVar2 = fdb_error_msg(fVar1);
        uVar4 = 0x66;
      }
      goto LAB_00104077;
    }
  }
  pcVar2 = fdb_error_msg(fVar1);
  uVar4 = 0x5a;
LAB_00103eed:
  fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,(ulong)uVar4);
  pcVar2 = "false";
LAB_00103f1c:
  verify_stale_block_reuse_test()::__test_pass = 1;
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,uVar4,"void verify_stale_block_reuse_test()");
}

Assistant:

void verify_stale_block_reuse_test() {
    TEST_INIT();

    int i, r;
    fdb_file_handle* dbfile;
    fdb_kvs_handle* db, *lazy;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    size_t fileSize1, fileSize2;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;

    fconfig.block_reusing_threshold = 20;
    status = fdb_open(&dbfile, (char *)"./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);

    size_t valuesize = 10240; // 10K buffer
    char *val = new char[valuesize]();
    const char *key = "key";
    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    for (i = 0; i < 3000; ++i) { // 3000 * 10K
        status = fdb_set_kv(db, key, strlen(key) + 1, val, valuesize);
        TEST_STATUS(status);
        i++;
        if (!(i % 100)) { // commit 30 times
            status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_STATUS(status);
        }
    }

    fdb_file_info file_info;
    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    fileSize1 = file_info.file_size; // record file size first

    // open a 'lazy' handle that does not issue any forestdb calls..
    status = fdb_kvs_open(dbfile, &lazy, "lazy", &kvs_config);
    TEST_STATUS(status);

    // 100 commits which should all reuse stale blocks
    for (i = 0; i < 1000; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1,
                            val, 10);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    fileSize2 = file_info.file_size; // record file size first
    // ensure file size has not exploded and is within 30% of original filesize
    TEST_CHK(double(fileSize2) < double(fileSize1) * 1.3);

    // cleanup
    delete [] val;
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    TEST_RESULT("basic stale block reuse test");
}